

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O0

bool __thiscall SNMPTrap::setInform(SNMPTrap *this,bool inf)

{
  SNMP_VERSION SVar1;
  ASN_TYPE local_18;
  ASN_TYPE pduType;
  bool inf_local;
  SNMPTrap *this_local;
  
  this->inform = inf;
  local_18 = (this->super_SNMPPacket).packetPDUType;
  SVar1 = (this->super_SNMPPacket).snmpVersion;
  if (SVar1 == SNMP_VERSION_1) {
    local_18 = TrapPDU;
  }
  else if ((SVar1 == SNMP_VERSION_2C) && (local_18 = Trapv2PDU, (this->inform & 1U) != 0)) {
    local_18 = InformRequestPDU;
  }
  SNMPPacket::setPDUType(&this->super_SNMPPacket,local_18);
  return true;
}

Assistant:

bool setInform(bool inf){
        this->inform = inf;
        ASN_TYPE pduType = this->packetPDUType;
        switch(this->snmpVersion){
            case SNMP_VERSION_1:
                pduType = TrapPDU;
            break;
            case SNMP_VERSION_2C:
                pduType = this->inform ? InformRequestPDU : Trapv2PDU;
            break;
            default:
            break;
        }
        this->setPDUType(pduType);
        return true;
    }